

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# cfdcore_taproot.cpp
# Opt level: O1

bool cfd::core::TaprootUtil::IsValidLeafVersion(uint8_t leaf_version)

{
  long lVar1;
  long lVar2;
  undefined3 in_register_00000039;
  bool bVar3;
  
  bVar3 = true;
  if (CONCAT31(in_register_00000039,leaf_version) != 0x66) {
    lVar1 = 0;
    do {
      lVar2 = lVar1;
      if (lVar2 == 0x20) goto LAB_0036ad43;
      lVar1 = lVar2 + 4;
    } while (*(int *)((long)IsValidLeafVersion::kValidLeafVersions + lVar2 + 4) !=
             CONCAT31(in_register_00000039,leaf_version));
    if (lVar2 == 0x20) {
LAB_0036ad43:
      if ((leaf_version & 1) != 0) {
        return false;
      }
      bVar3 = (byte)(leaf_version + 0x40) < 0x3f;
    }
  }
  return bVar3;
}

Assistant:

bool TaprootUtil::IsValidLeafVersion(uint8_t leaf_version) {
  // BIP-0341
  static const uint32_t kValidLeafVersions[] = {0x66, 0x7e, 0x80, 0x84, 0x96,
                                                0x98, 0xba, 0xbc, 0xbe};
  for (auto valid_ver : kValidLeafVersions) {
    if (leaf_version == valid_ver) return true;
  }

  if ((leaf_version % 2) != 0) return false;  // Odd
  if ((leaf_version >= 0xc0) && (leaf_version <= 0xfe)) return true;
  return false;
}